

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O1

void __thiscall BBDT<UF>::PerformLabeling(BBDT<UF> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  uint local_e8;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar9 = *(uint *)&pMVar4->field_0x8;
  uVar20 = (ulong)uVar9;
  iVar21 = *(int *)&pMVar4->field_0xc;
  lVar26 = (long)iVar21;
  cv::Mat::Mat(local_90,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  UF::P_ = (uint *)operator_new__((ulong)(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                                          ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  if (0 < (int)uVar9) {
    uVar13 = 0;
    do {
      if (0 < iVar21) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar19 = **(long **)&pMVar4->field_0x48;
        lVar22 = lVar19 * uVar13 + *(long *)&pMVar4->field_0x10;
        lVar23 = lVar22 - lVar19;
        lVar17 = lVar23 - lVar19;
        lVar19 = lVar19 + lVar22;
        lVar25 = **(long **)&pMVar5->field_0x48;
        lVar24 = lVar25 * uVar13 + *(long *)&pMVar5->field_0x10;
        lVar25 = lVar24 + lVar25 * -2;
        uVar29 = uVar13 | 1;
        uVar28 = 0;
        do {
          puVar6 = UF::P_;
          if (*(char *)(lVar22 + uVar28) == '\0') {
            if ((uVar29 < uVar20) && (*(char *)(lVar19 + uVar28) != '\0')) {
              uVar11 = uVar28 | 1;
              if (((long)uVar11 < lVar26) && (*(char *)(lVar22 + uVar11) != '\0')) {
                if (uVar28 != 0) {
                  if (*(char *)((uVar28 - 1) + lVar22) == '\0') {
                    if (*(char *)(lVar19 + -1 + uVar28) != '\0') {
                      if ((uVar13 == 0) || (*(char *)(lVar23 + uVar11) == '\0')) {
                        if ((uVar13 == 0) ||
                           ((lVar26 <= (long)(uVar28 + 2) ||
                            (*(char *)(lVar23 + uVar28 + 2) == '\0')))) {
                          if ((uVar13 == 0) || (*(char *)(lVar23 + uVar28) == '\0'))
                          goto LAB_00183d33;
                          if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                            uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else {
                            if (*(char *)(lVar23 + -1 + uVar28) != '\0') goto LAB_00183d33;
                            if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                              uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                              do {
                                uVar14 = uVar9;
                                uVar9 = UF::P_[uVar14];
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              } while (UF::P_[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                            }
                            else {
                              if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                              uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                              do {
                                uVar14 = uVar9;
                                uVar9 = UF::P_[uVar14];
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              } while (UF::P_[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                            }
                          }
                        }
                        else if (*(char *)(lVar17 + uVar11) == '\0') {
                          if (*(char *)(lVar23 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                            uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                            do {
                              uVar18 = uVar9;
                              uVar9 = UF::P_[uVar18];
                              uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            } while (UF::P_[uVar18] < uVar18);
                            do {
                              uVar9 = uVar14;
                              uVar14 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                            uVar14 = uVar9;
                            if (uVar18 >= uVar9 && uVar18 != uVar9) {
                              uVar14 = uVar18;
                            }
                            if (uVar18 < uVar9) {
                              uVar9 = uVar18;
                            }
                            UF::P_[uVar14] = uVar9;
                            do {
                              uVar14 = uVar9;
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              uVar9 = puVar6[uVar14];
                            } while (puVar6[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = puVar6[uVar9];
                            } while (puVar6[uVar9] < uVar9);
                          }
                          else if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                            if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                              uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                              do {
                                uVar18 = uVar9;
                                uVar9 = UF::P_[uVar18];
                                uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              } while (UF::P_[uVar18] < uVar18);
                              do {
                                uVar9 = uVar14;
                                uVar14 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                              uVar14 = uVar9;
                              if (uVar18 >= uVar9 && uVar18 != uVar9) {
                                uVar14 = uVar18;
                              }
                              if (uVar18 < uVar9) {
                                uVar9 = uVar18;
                              }
                              UF::P_[uVar14] = uVar9;
                              do {
                                uVar14 = uVar9;
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                                uVar9 = puVar6[uVar14];
                              } while (puVar6[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = puVar6[uVar9];
                              } while (puVar6[uVar9] < uVar9);
                            }
                            else if (*(char *)(lVar17 + -1 + uVar28) == '\0') {
                              uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                              do {
                                uVar18 = uVar9;
                                uVar9 = UF::P_[uVar18];
                                uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              } while (UF::P_[uVar18] < uVar18);
                              do {
                                uVar9 = uVar14;
                                uVar14 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                              uVar14 = uVar9;
                              if (uVar18 >= uVar9 && uVar18 != uVar9) {
                                uVar14 = uVar18;
                              }
                              if (uVar18 < uVar9) {
                                uVar9 = uVar18;
                              }
                              UF::P_[uVar14] = uVar9;
                              do {
                                uVar14 = uVar9;
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                                uVar9 = puVar6[uVar14];
                              } while (puVar6[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = puVar6[uVar9];
                              } while (puVar6[uVar9] < uVar9);
                            }
                            else {
                              uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              do {
                                uVar14 = uVar9;
                                uVar9 = UF::P_[uVar14];
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              } while (UF::P_[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                            }
                          }
                          else {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                        }
                        else if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                          if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else if (*(char *)(lVar17 + -1 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else {
                            if ((*(char *)(lVar23 + uVar28) != '\0') ||
                               (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                        }
                        else {
                          if ((*(char *)(lVar23 + uVar28) != '\0') ||
                             (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                      }
                      else if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      else if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                        if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                          uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else if (*(char *)(lVar17 + -1 + uVar28) == '\0') {
                          uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else {
                          if ((*(char *)(lVar23 + uVar28) != '\0') ||
                             (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                          uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                      }
                      else {
                        if ((*(char *)(lVar23 + uVar28) != '\0') ||
                           (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      goto LAB_0018419b;
                    }
                    goto LAB_001832be;
                  }
                  if ((uVar13 == 0) || (*(char *)(lVar23 + uVar11) == '\0')) {
                    if (((uVar13 != 0) && ((long)(uVar28 + 2) < lVar26)) &&
                       (*(char *)(lVar23 + uVar28 + 2) != '\0')) {
                      if (*(char *)(lVar17 + uVar11) == '\0') {
                        uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar23 + uVar28) != '\0') goto LAB_00183d33;
                        if (*(char *)(lVar17 + uVar28) == '\0') {
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else {
                          if (*(char *)(lVar23 + -1 + uVar28) != '\0') goto LAB_00183d33;
                          if (*(char *)((uVar28 - 2) + lVar23) == '\0') {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else {
                            if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                        }
                      }
                      goto LAB_0018419b;
                    }
                    goto LAB_00183d33;
                  }
                  if (*(char *)(lVar23 + uVar28) != '\0') goto LAB_00183d33;
                  if (*(char *)(lVar17 + uVar28) == '\0') {
                    uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                    do {
                      uVar14 = uVar9;
                      uVar9 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar14] < uVar14);
                    do {
                      uVar9 = uVar18;
                      uVar18 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                  }
                  else {
                    if (*(char *)(lVar23 + -1 + uVar28) != '\0') goto LAB_00183d33;
                    if (*(char *)((uVar28 - 2) + lVar23) == '\0') {
                      uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                      do {
                        uVar14 = uVar9;
                        uVar9 = UF::P_[uVar14];
                        uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar14] < uVar14);
                      do {
                        uVar9 = uVar18;
                        uVar18 = UF::P_[uVar9];
                      } while (UF::P_[uVar9] < uVar9);
                    }
                    else {
                      if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                      uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                      do {
                        uVar14 = uVar9;
                        uVar9 = UF::P_[uVar14];
                        uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar14] < uVar14);
                      do {
                        uVar9 = uVar18;
                        uVar18 = UF::P_[uVar9];
                      } while (UF::P_[uVar9] < uVar9);
                    }
                  }
                  goto LAB_0018419b;
                }
LAB_001832be:
                if ((uVar13 == 0) || (*(char *)(lVar23 + uVar11) == '\0')) {
                  if ((uVar13 != 0) &&
                     (((long)(uVar28 + 2) < lVar26 && (*(char *)(lVar23 + uVar28 + 2) != '\0')))) {
                    if ((*(char *)(lVar23 + uVar28) == '\0') || (*(char *)(lVar17 + uVar11) != '\0')
                       ) goto LAB_0018336f;
                    uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                    do {
                      uVar14 = uVar9;
                      uVar9 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                    } while (UF::P_[uVar14] < uVar14);
                    do {
                      uVar9 = uVar18;
                      uVar18 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                    goto LAB_0018419b;
                  }
LAB_00183320:
                  if ((uVar13 == 0) || (*(char *)(lVar23 + uVar28) == '\0')) goto LAB_00183330;
                }
                goto LAB_00183027;
              }
              if ((uVar28 != 0) &&
                 ((*(char *)((uVar28 - 1) + lVar19) != '\0' ||
                  (*(char *)(lVar22 + -1 + uVar28) != '\0')))) goto LAB_00183d33;
LAB_00183330:
              UF::P_[UF::length_] = UF::length_;
              uVar9 = UF::length_ + 1;
              *(uint *)(lVar24 + uVar28 * 4) = UF::length_;
              UF::length_ = uVar9;
            }
            else {
              uVar11 = uVar28 | 1;
              if ((long)uVar11 < lVar26) {
                if (*(char *)(lVar22 + uVar11) == '\0') {
                  if ((uVar29 < uVar20) && (*(char *)(lVar19 + uVar11) != '\0')) goto LAB_00183330;
                  goto LAB_00183091;
                }
                if ((uVar13 != 0) && (*(char *)(lVar23 + uVar11) != '\0')) goto LAB_00183027;
                if (((uVar13 == 0) || (lVar26 <= (long)(uVar28 + 2))) ||
                   (*(char *)(lVar23 + uVar28 + 2) == '\0')) goto LAB_00183320;
                if ((*(char *)(lVar23 + uVar28) != '\0') && (*(char *)(lVar17 + uVar11) == '\0')) {
                  uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                  do {
                    uVar14 = uVar9;
                    uVar9 = UF::P_[uVar14];
                    uVar18 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                  } while (UF::P_[uVar14] < uVar14);
                  do {
                    uVar9 = uVar18;
                    uVar18 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  goto LAB_0018419b;
                }
                goto LAB_0018336f;
              }
LAB_00183091:
              *(undefined4 *)(lVar24 + uVar28 * 4) = 0;
            }
          }
          else {
            if (uVar28 == 0) {
LAB_00182f4b:
              uVar11 = uVar28 | 1;
              if (((uVar13 == 0) || (lVar26 <= (long)uVar11)) ||
                 (*(char *)(lVar23 + uVar11) == '\0')) {
                if ((((long)uVar11 < lVar26) && (*(char *)(lVar22 + uVar11) != '\0')) &&
                   ((uVar13 != 0 &&
                    (((long)(uVar28 + 2) < lVar26 && (*(char *)(lVar23 + uVar28 + 2) != '\0')))))) {
                  if (*(char *)(lVar23 + uVar28) == '\0') {
                    if ((uVar28 != 0) && (*(char *)(lVar23 + -1 + uVar28) != '\0')) {
                      if (*(char *)(lVar17 + uVar11) == '\0') {
                        uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      else {
                        if (*(char *)(lVar17 + uVar28) != '\0') goto LAB_0018336f;
                        uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
LAB_0018419b:
                      uVar18 = uVar9;
                      if (uVar9 < uVar14) {
                        uVar18 = uVar14;
                      }
                      if (uVar14 < uVar9) {
                        uVar9 = uVar14;
                      }
                      puVar6[uVar18] = uVar9;
                      *(uint *)(lVar24 + uVar28 * 4) = uVar9;
                      goto LAB_00183d3c;
                    }
                  }
                  else if (*(char *)(lVar17 + uVar11) == '\0') {
                    uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                    do {
                      uVar14 = uVar9;
                      uVar9 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                    } while (UF::P_[uVar14] < uVar14);
                    do {
                      uVar9 = uVar18;
                      uVar18 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                    goto LAB_0018419b;
                  }
LAB_0018336f:
                  uVar8 = *(undefined4 *)(lVar25 + 8 + uVar28 * 4);
                  goto LAB_00183d38;
                }
                if ((uVar13 == 0) || (*(char *)(lVar23 + uVar28) == '\0')) {
                  if ((uVar13 == 0 || uVar28 == 0) || (*(char *)(lVar23 + -1 + uVar28) == '\0'))
                  goto LAB_00183330;
                  uVar8 = *(undefined4 *)(lVar25 + -8 + uVar28 * 4);
                  goto LAB_00183d38;
                }
              }
              else if ((((*(char *)(lVar23 + uVar28) == '\0') && (uVar28 != 0)) &&
                       (*(char *)(lVar23 + -1 + uVar28) != '\0')) &&
                      (*(char *)(lVar17 + uVar28) == '\0')) {
                uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                do {
                  uVar14 = uVar9;
                  uVar9 = UF::P_[uVar14];
                  uVar18 = *(uint *)(lVar25 + uVar28 * 4);
                } while (UF::P_[uVar14] < uVar14);
                do {
                  uVar9 = uVar18;
                  uVar18 = UF::P_[uVar9];
                } while (UF::P_[uVar9] < uVar9);
                goto LAB_0018419b;
              }
LAB_00183027:
              uVar8 = *(undefined4 *)(lVar25 + uVar28 * 4);
            }
            else {
              if (*(char *)(lVar22 + -1 + uVar28) == '\0') {
                if ((uVar29 < uVar20) && (*(char *)(lVar19 + -1 + uVar28) != '\0')) {
                  uVar11 = uVar28 | 1;
                  if ((uVar13 != 0) &&
                     (((long)uVar11 < lVar26 && (*(char *)(lVar23 + uVar11) != '\0')))) {
                    if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                      if (*(char *)(lVar23 + uVar28) == '\0') {
                        if (*(char *)(lVar23 + -1 + uVar28) != '\0') {
                          if (*(char *)(lVar17 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                            do {
                              uVar18 = uVar9;
                              uVar9 = UF::P_[uVar18];
                              uVar14 = *(uint *)(lVar25 + uVar28 * 4);
                            } while (UF::P_[uVar18] < uVar18);
                            do {
                              uVar9 = uVar14;
                              uVar14 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                            uVar14 = uVar9;
                            if (uVar18 >= uVar9 && uVar18 != uVar9) {
                              uVar14 = uVar18;
                            }
                            if (uVar18 < uVar9) {
                              uVar9 = uVar18;
                            }
                            UF::P_[uVar14] = uVar9;
                            do {
                              uVar14 = uVar9;
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              uVar9 = puVar6[uVar14];
                            } while (puVar6[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = puVar6[uVar9];
                            } while (puVar6[uVar9] < uVar9);
                          }
                          else {
                            uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          goto LAB_0018419b;
                        }
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar18 = uVar9;
                          uVar9 = UF::P_[uVar18];
                          uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar18] < uVar18);
                        do {
                          uVar9 = uVar14;
                          uVar14 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      else {
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar18 = uVar9;
                          uVar9 = UF::P_[uVar18];
                          uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar18] < uVar18);
                        do {
                          uVar9 = uVar14;
                          uVar14 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                    }
                    else if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                      if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar18 = uVar9;
                          uVar9 = UF::P_[uVar18];
                          uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar18] < uVar18);
                        do {
                          uVar9 = uVar14;
                          uVar14 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      else if (*(char *)(lVar17 + -1 + uVar28) == '\0') {
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar18 = uVar9;
                          uVar9 = UF::P_[uVar18];
                          uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar18] < uVar18);
                        do {
                          uVar9 = uVar14;
                          uVar14 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      else {
                        if ((*(char *)(lVar23 + uVar28) != '\0') ||
                           (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar18 = uVar9;
                          uVar9 = UF::P_[uVar18];
                          uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar18] < uVar18);
                        do {
                          uVar9 = uVar14;
                          uVar14 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                    }
                    else {
                      if ((*(char *)(lVar23 + uVar28) != '\0') ||
                         (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                      uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                      do {
                        uVar18 = uVar9;
                        uVar9 = UF::P_[uVar18];
                        uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar18] < uVar18);
                      do {
                        uVar9 = uVar14;
                        uVar14 = UF::P_[uVar9];
                      } while (UF::P_[uVar9] < uVar9);
                    }
                    goto LAB_00183dce;
                  }
                  if (((long)uVar11 < lVar26) && (*(char *)(lVar22 + uVar11) != '\0')) {
                    if (((uVar13 != 0) && ((long)(uVar28 + 2) < lVar26)) &&
                       (*(char *)(lVar23 + uVar28 + 2) != '\0')) {
                      if (*(char *)((uVar28 - 2) + lVar22) != '\0') {
                        if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                          if (*(char *)(lVar17 + uVar11) == '\0') {
                            if (*(char *)(lVar23 + uVar28) == '\0') {
                              uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              do {
                                uVar14 = uVar9;
                                uVar9 = UF::P_[uVar14];
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              } while (UF::P_[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                            }
                            else if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                              uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                              do {
                                uVar18 = uVar9;
                                uVar9 = UF::P_[uVar18];
                                uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              } while (UF::P_[uVar18] < uVar18);
                              do {
                                uVar9 = uVar14;
                                uVar14 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                              uVar14 = uVar9;
                              if (uVar18 >= uVar9 && uVar18 != uVar9) {
                                uVar14 = uVar18;
                              }
                              if (uVar18 < uVar9) {
                                uVar9 = uVar18;
                              }
                              UF::P_[uVar14] = uVar9;
                              do {
                                uVar14 = uVar9;
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                                uVar9 = puVar6[uVar14];
                              } while (puVar6[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = puVar6[uVar9];
                              } while (puVar6[uVar9] < uVar9);
                            }
                            else if (*(char *)(lVar17 + -1 + uVar28) == '\0') {
                              uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                              do {
                                uVar18 = uVar9;
                                uVar9 = UF::P_[uVar18];
                                uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              } while (UF::P_[uVar18] < uVar18);
                              do {
                                uVar9 = uVar14;
                                uVar14 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                              uVar14 = uVar9;
                              if (uVar18 >= uVar9 && uVar18 != uVar9) {
                                uVar14 = uVar18;
                              }
                              if (uVar18 < uVar9) {
                                uVar9 = uVar18;
                              }
                              UF::P_[uVar14] = uVar9;
                              do {
                                uVar14 = uVar9;
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                                uVar9 = puVar6[uVar14];
                              } while (puVar6[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = puVar6[uVar9];
                              } while (puVar6[uVar9] < uVar9);
                            }
                            else {
                              uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                              do {
                                uVar14 = uVar9;
                                uVar9 = UF::P_[uVar14];
                                uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                              } while (UF::P_[uVar14] < uVar14);
                              do {
                                uVar9 = uVar18;
                                uVar18 = UF::P_[uVar9];
                              } while (UF::P_[uVar9] < uVar9);
                            }
                            goto LAB_0018419b;
                          }
                          if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar18 = uVar9;
                              uVar9 = UF::P_[uVar18];
                              uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar18] < uVar18);
                            do {
                              uVar9 = uVar14;
                              uVar14 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else if (*(char *)(lVar17 + -1 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar18 = uVar9;
                              uVar9 = UF::P_[uVar18];
                              uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar18] < uVar18);
                            do {
                              uVar9 = uVar14;
                              uVar14 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else {
                            if ((*(char *)(lVar23 + uVar28) != '\0') ||
                               (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                            uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                            do {
                              uVar18 = uVar9;
                              uVar9 = UF::P_[uVar18];
                              uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar18] < uVar18);
                            do {
                              uVar9 = uVar14;
                              uVar14 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                        }
                        else if (*(char *)(lVar17 + uVar11) == '\0') {
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar18 = uVar9;
                            uVar9 = UF::P_[uVar18];
                            uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar18] < uVar18);
                          do {
                            uVar9 = uVar14;
                            uVar14 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else {
                          if ((*(char *)(lVar23 + uVar28) != '\0') ||
                             (*(char *)(lVar17 + uVar28) != '\0')) goto LAB_00183d33;
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar18 = uVar9;
                            uVar9 = UF::P_[uVar18];
                            uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar18] < uVar18);
                          do {
                            uVar9 = uVar14;
                            uVar14 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        goto LAB_00183dce;
                      }
                      if (*(char *)(lVar23 + uVar28) == '\0') {
                        if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else if (*(char *)(lVar17 + uVar11) == '\0') {
                          uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                          do {
                            uVar18 = uVar9;
                            uVar9 = UF::P_[uVar18];
                            uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          } while (UF::P_[uVar18] < uVar18);
                          do {
                            uVar9 = uVar14;
                            uVar14 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                          uVar14 = uVar9;
                          if (uVar18 >= uVar9 && uVar18 != uVar9) {
                            uVar14 = uVar18;
                          }
                          if (uVar18 < uVar9) {
                            uVar9 = uVar18;
                          }
                          UF::P_[uVar14] = uVar9;
                          do {
                            uVar14 = uVar9;
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            uVar9 = puVar6[uVar14];
                          } while (puVar6[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = puVar6[uVar9];
                          } while (puVar6[uVar9] < uVar9);
                        }
                        else if (*(char *)(lVar17 + uVar28) == '\0') {
                          uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                          do {
                            uVar18 = uVar9;
                            uVar9 = UF::P_[uVar18];
                            uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          } while (UF::P_[uVar18] < uVar18);
                          do {
                            uVar9 = uVar14;
                            uVar14 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                          uVar14 = uVar9;
                          if (uVar18 >= uVar9 && uVar18 != uVar9) {
                            uVar14 = uVar18;
                          }
                          if (uVar18 < uVar9) {
                            uVar9 = uVar18;
                          }
                          UF::P_[uVar14] = uVar9;
                          do {
                            uVar14 = uVar9;
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            uVar9 = puVar6[uVar14];
                          } while (puVar6[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = puVar6[uVar9];
                          } while (puVar6[uVar9] < uVar9);
                        }
                        else {
                          uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                      }
                      else if (*(char *)(lVar17 + uVar11) == '\0') {
                        uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                        do {
                          uVar18 = uVar9;
                          uVar9 = UF::P_[uVar18];
                          uVar14 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                        } while (UF::P_[uVar18] < uVar18);
                        do {
                          uVar9 = uVar14;
                          uVar14 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                        uVar14 = uVar9;
                        if (uVar18 >= uVar9 && uVar18 != uVar9) {
                          uVar14 = uVar18;
                        }
                        if (uVar18 < uVar9) {
                          uVar9 = uVar18;
                        }
                        UF::P_[uVar14] = uVar9;
                        do {
                          uVar14 = uVar9;
                          uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          uVar9 = puVar6[uVar14];
                        } while (puVar6[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = puVar6[uVar9];
                        } while (puVar6[uVar9] < uVar9);
                      }
                      else {
                        uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                      }
                      goto LAB_0018419b;
                    }
                    if (uVar13 != 0) {
                      if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                        if (*(char *)(lVar23 + uVar28) != '\0') {
                          if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                            uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                            uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          else {
                            if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                            uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                            do {
                              uVar14 = uVar9;
                              uVar9 = UF::P_[uVar14];
                              uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                            } while (UF::P_[uVar14] < uVar14);
                            do {
                              uVar9 = uVar18;
                              uVar18 = UF::P_[uVar9];
                            } while (UF::P_[uVar9] < uVar9);
                          }
                          goto LAB_0018419b;
                        }
                      }
                      else if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                        uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                        do {
                          uVar14 = uVar9;
                          uVar9 = UF::P_[uVar14];
                          uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                        } while (UF::P_[uVar14] < uVar14);
                        do {
                          uVar9 = uVar18;
                          uVar18 = UF::P_[uVar9];
                        } while (UF::P_[uVar9] < uVar9);
                        goto LAB_0018419b;
                      }
                    }
                  }
                  else if (uVar13 != 0) {
                    if (*(char *)(lVar23 + -1 + uVar28) == '\0') {
                      if (*(char *)(lVar23 + uVar28) != '\0') {
                        if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                          uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else if (*(char *)(lVar23 + -2 + uVar28) == '\0') {
                          uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        else {
                          if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                          uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                          do {
                            uVar14 = uVar9;
                            uVar9 = UF::P_[uVar14];
                            uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                          } while (UF::P_[uVar14] < uVar14);
                          do {
                            uVar9 = uVar18;
                            uVar18 = UF::P_[uVar9];
                          } while (UF::P_[uVar9] < uVar9);
                        }
                        goto LAB_0018419b;
                      }
                    }
                    else if (*(char *)((uVar28 - 2) + lVar22) == '\0') {
                      uVar9 = *(uint *)(lVar25 + -8 + uVar28 * 4);
                      do {
                        uVar14 = uVar9;
                        uVar9 = UF::P_[uVar14];
                        uVar18 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar14] < uVar14);
                      do {
                        uVar9 = uVar18;
                        uVar18 = UF::P_[uVar9];
                      } while (UF::P_[uVar9] < uVar9);
                      goto LAB_0018419b;
                    }
                  }
                  goto LAB_00183d33;
                }
                goto LAB_00182f4b;
              }
              uVar11 = uVar28 | 1;
              if (((uVar13 == 0) || (lVar26 <= (long)uVar11)) ||
                 (*(char *)(lVar23 + uVar11) == '\0')) {
                if (((lVar26 <= (long)uVar11) || (*(char *)(lVar22 + uVar11) == '\0')) ||
                   ((uVar13 == 0 ||
                    ((lVar26 <= (long)(uVar28 + 2) || (*(char *)(lVar23 + uVar28 + 2) == '\0'))))))
                goto LAB_00183d33;
                if (*(char *)(lVar17 + uVar11) == '\0') {
                  uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                  do {
                    uVar18 = uVar9;
                    uVar9 = UF::P_[uVar18];
                    uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                  } while (UF::P_[uVar18] < uVar18);
                  do {
                    uVar9 = uVar14;
                    uVar14 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                }
                else {
                  if (*(char *)(lVar23 + uVar28) != '\0') goto LAB_00183d33;
                  if (*(char *)(lVar17 + uVar28) == '\0') {
                    uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                    do {
                      uVar18 = uVar9;
                      uVar9 = UF::P_[uVar18];
                      uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar18] < uVar18);
                    do {
                      uVar9 = uVar14;
                      uVar14 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                  }
                  else {
                    if (*(char *)(lVar23 + -1 + uVar28) != '\0') goto LAB_00183d33;
                    if (*(char *)((uVar28 - 2) + lVar23) == '\0') {
                      uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                      do {
                        uVar18 = uVar9;
                        uVar9 = UF::P_[uVar18];
                        uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar18] < uVar18);
                      do {
                        uVar9 = uVar14;
                        uVar14 = UF::P_[uVar9];
                      } while (UF::P_[uVar9] < uVar9);
                    }
                    else {
                      if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                      uVar9 = *(uint *)(lVar25 + 8 + uVar28 * 4);
                      do {
                        uVar18 = uVar9;
                        uVar9 = UF::P_[uVar18];
                        uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                      } while (UF::P_[uVar18] < uVar18);
                      do {
                        uVar9 = uVar14;
                        uVar14 = UF::P_[uVar9];
                      } while (UF::P_[uVar9] < uVar9);
                    }
                  }
                }
LAB_00183dce:
                uVar14 = uVar9;
                if (uVar9 < uVar18) {
                  uVar14 = uVar18;
                }
                if (uVar18 < uVar9) {
                  uVar9 = uVar18;
                }
                UF::P_[uVar14] = uVar9;
                *(uint *)(lVar24 + uVar28 * 4) = uVar9;
                goto LAB_00183d3c;
              }
              if (*(char *)(lVar23 + uVar28) == '\0') {
                if (*(char *)(lVar17 + uVar28) == '\0') {
                  uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                  do {
                    uVar18 = uVar9;
                    uVar9 = UF::P_[uVar18];
                    uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                  } while (UF::P_[uVar18] < uVar18);
                  do {
                    uVar9 = uVar14;
                    uVar14 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                }
                else {
                  if (*(char *)(lVar23 + -1 + uVar28) != '\0') goto LAB_00183d33;
                  if (*(char *)((uVar28 - 2) + lVar23) == '\0') {
                    uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                    do {
                      uVar18 = uVar9;
                      uVar9 = UF::P_[uVar18];
                      uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar18] < uVar18);
                    do {
                      uVar9 = uVar14;
                      uVar14 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                  }
                  else {
                    if (*(char *)(lVar17 + -1 + uVar28) != '\0') goto LAB_00183d33;
                    uVar9 = *(uint *)(lVar25 + uVar28 * 4);
                    do {
                      uVar18 = uVar9;
                      uVar9 = UF::P_[uVar18];
                      uVar14 = *(uint *)(lVar24 + -8 + uVar28 * 4);
                    } while (UF::P_[uVar18] < uVar18);
                    do {
                      uVar9 = uVar14;
                      uVar14 = UF::P_[uVar9];
                    } while (UF::P_[uVar9] < uVar9);
                  }
                }
                goto LAB_00183dce;
              }
LAB_00183d33:
              uVar8 = *(undefined4 *)(lVar24 + -8 + uVar28 * 4);
            }
LAB_00183d38:
            *(undefined4 *)(lVar24 + uVar28 * 4) = uVar8;
          }
LAB_00183d3c:
          uVar28 = uVar28 + 2;
        } while ((long)uVar28 < lVar26);
      }
      uVar13 = uVar13 + 2;
    } while (uVar13 < uVar20);
  }
  puVar6 = UF::P_;
  uVar9 = 1;
  if (1 < UF::length_) {
    uVar20 = 1;
    do {
      if (puVar6[uVar20] < uVar20) {
        puVar6[uVar20] = puVar6[puVar6[uVar20]];
      }
      else {
        puVar6[uVar20] = uVar9;
        uVar9 = uVar9 + 1;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < UF::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar6 = UF::P_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar9 = *(uint *)&pMVar5->field_0x8;
  uVar18 = uVar9 & 0xfffffffe;
  uVar14 = *(uint *)&pMVar5->field_0xc;
  local_e8 = uVar14 & 0x80000001;
  uVar13 = (long)(int)uVar14 & 0xfffffffffffffffe;
  uVar20 = 0;
  iVar21 = (int)uVar13;
  if (0 < (int)uVar18) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar17 = *(long *)&pMVar4->field_0x10;
    lVar22 = **(long **)&pMVar4->field_0x48;
    lVar23 = *(long *)&pMVar5->field_0x10;
    lVar24 = **(long **)&pMVar5->field_0x48;
    lVar19 = lVar23 + lVar24;
    lVar25 = lVar17 + 1 + lVar22;
    lVar26 = lVar17 + 1;
    uVar20 = 0;
    lVar30 = lVar23;
    do {
      puVar7 = UF::P_;
      lVar31 = lVar24 * uVar20 + lVar23;
      lVar1 = lVar31 + lVar24;
      if (iVar21 < 1) {
        uVar28 = 0;
      }
      else {
        uVar28 = 0;
        do {
          lVar27 = (long)*(int *)(lVar30 + uVar28 * 4);
          if (lVar27 < 1) {
            *(undefined8 *)(lVar30 + uVar28 * 4) = 0;
            uVar29 = uVar28 + 1;
            *(undefined4 *)(lVar19 + uVar28 * 4) = 0;
            uVar10 = 0;
          }
          else {
            uVar10 = puVar7[lVar27];
            uVar15 = 0;
            uVar16 = uVar10;
            if (*(char *)(lVar26 + -1 + uVar28) == '\0') {
              uVar16 = uVar15;
            }
            *(uint *)(lVar30 + uVar28 * 4) = uVar16;
            uVar29 = uVar28 | 1;
            uVar16 = uVar10;
            if (*(char *)(lVar26 + uVar28) == '\0') {
              uVar16 = uVar15;
            }
            *(uint *)(lVar30 + 4 + uVar28 * 4) = uVar16;
            uVar16 = uVar10;
            if (*(char *)(lVar25 + -1 + uVar28) == '\0') {
              uVar16 = uVar15;
            }
            *(uint *)(lVar19 + uVar28 * 4) = uVar16;
            if (*(char *)(lVar25 + uVar28) == '\0') {
              uVar10 = 0;
            }
          }
          *(uint *)(lVar1 + uVar29 * 4) = uVar10;
          uVar28 = uVar28 + 2;
        } while ((long)uVar28 < (long)uVar13);
      }
      if (local_e8 == 1) {
        lVar27 = (long)*(int *)(lVar31 + uVar28 * 4);
        if (lVar27 < 1) {
          *(undefined4 *)(lVar31 + uVar28 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar28 * 4) = 0;
        }
        else {
          lVar12 = lVar22 * uVar20 + lVar17;
          uVar10 = puVar6[lVar27];
          uVar16 = uVar10;
          if (*(char *)(lVar12 + uVar28) == '\0') {
            uVar16 = 0;
          }
          *(uint *)(lVar31 + uVar28 * 4) = uVar16;
          if (*(char *)(lVar12 + lVar22 + uVar28) == '\0') {
            *(undefined4 *)(lVar1 + uVar28 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar28 * 4) = uVar10;
          }
        }
      }
      uVar20 = uVar20 + 2;
      lVar19 = lVar19 + lVar24 * 2;
      lVar25 = lVar25 + lVar22 * 2;
      lVar26 = lVar26 + lVar22 * 2;
      lVar30 = lVar30 + lVar24 * 2;
    } while (uVar20 < uVar18);
    uVar20 = uVar20 & 0xffffffff;
  }
  puVar6 = UF::P_;
  if ((uVar9 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar26 = *(long *)&pMVar4->field_0x10;
    lVar17 = **(long **)&pMVar4->field_0x48 * uVar20;
    lVar19 = *(long *)&pMVar5->field_0x10;
    lVar25 = uVar20 * **(long **)&pMVar5->field_0x48;
    if (iVar21 < 1) {
      uVar20 = 0;
    }
    else {
      lVar22 = lVar17 + lVar26;
      lVar23 = lVar25 + lVar19;
      uVar20 = 0;
      do {
        lVar24 = (long)*(int *)(lVar23 + uVar20 * 4);
        if (lVar24 < 1) {
          *(undefined8 *)(lVar23 + uVar20 * 4) = 0;
        }
        else {
          uVar9 = puVar6[lVar24];
          uVar18 = uVar9;
          if (*(char *)(lVar22 + uVar20) == '\0') {
            uVar18 = 0;
          }
          *(uint *)(lVar23 + uVar20 * 4) = uVar18;
          if (*(char *)(lVar22 + 1 + uVar20) == '\0') {
            *(undefined4 *)(lVar23 + 4 + uVar20 * 4) = 0;
          }
          else {
            *(uint *)(lVar23 + 4 + uVar20 * 4) = uVar9;
          }
        }
        uVar20 = uVar20 + 2;
      } while (uVar20 < ((long)(int)uVar14 & 0xfffffffeU));
    }
    if (local_e8 == 1) {
      lVar19 = lVar19 + lVar25;
      lVar25 = (long)*(int *)(lVar19 + uVar20 * 4);
      uVar9 = 0;
      if ((0 < lVar25) && (uVar9 = 0, *(char *)(lVar26 + lVar17 + uVar20) != '\0')) {
        uVar9 = UF::P_[lVar25];
      }
      *(uint *)(lVar19 + uVar20 * 4) = uVar9;
    }
  }
  if (UF::P_ != (uint *)0x0) {
    operator_delete__(UF::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }